

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void changes(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  int iVar1;
  
  iVar1 = ((context->s).db)->nChange;
  sqlite3VdbeMemRelease(&context->s);
  (context->s).u = (anon_union_8_5_44880d43_for_u)(long)iVar1;
  (context->s).flags = 4;
  (context->s).type = '\x01';
  return;
}

Assistant:

static void changes(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  sqlite3_result_int(context, sqlite3_changes(db));
}